

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O0

_Bool GlCheckExtension(char *extension)

{
  GLint GVar1;
  int iVar2;
  _func_void *p_Var3;
  char *__s1;
  GLubyte *string;
  int i;
  GLint numExtensions;
  PFNGLGETSTRINGIPROC glGetStringi;
  char *extension_local;
  
  p_Var3 = GetExtension("glGetStringi");
  GVar1 = glGetInteger(0x821d);
  GlCheckErrors("const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS)");
  string._0_4_ = 0;
  while( true ) {
    if (GVar1 <= (int)(uint)string) {
      return false;
    }
    __s1 = (char *)(*p_Var3)(0x1f03,(ulong)(uint)string);
    GlCheckErrors("const GLubyte *string = glGetStringi(GL_EXTENSIONS, i)");
    iVar2 = strcmp(__s1,extension);
    if (iVar2 == 0) break;
    string._0_4_ = (uint)string + 1;
  }
  return true;
}

Assistant:

static bool GlCheckExtension(const char *extension) {
#if defined(OS_WINDOWS) || defined(OS_LINUX)
    PFNGLGETSTRINGIPROC glGetStringi = (PFNGLGETSTRINGIPROC)GetExtension("glGetStringi");
#endif
    GL(const GLint numExtensions = glGetInteger(GL_NUM_EXTENSIONS));
    for (int i = 0; i < numExtensions; i++) {
        GL(const GLubyte *string = glGetStringi(GL_EXTENSIONS, i));
        if (strcmp((const char *)string, extension) == 0) {
            return true;
        }
    }
    return false;
}